

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5e224c::SpotController::collective_flush
          (SpotController *this,OutputStream *stream,Comm *comm)

{
  string *psVar1;
  byte *pbVar2;
  long lVar3;
  undefined8 uVar4;
  CaliperMetadataDB *pCVar5;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  undefined1 auVar8 [8];
  bool bVar9;
  int iVar10;
  StreamType SVar11;
  uint uVar12;
  uint uVar13;
  ostream *poVar14;
  long *plVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  Node *pNVar17;
  ChannelBody *pCVar18;
  code **__dest;
  char *pcVar19;
  Node *pNVar20;
  size_t sVar21;
  pointer pEVar22;
  char *ext;
  AggregationOp *extraout_RDX;
  AggregationOp *extraout_RDX_00;
  AggregationOp *extraout_RDX_01;
  AggregationOp *extraout_RDX_02;
  AggregationOp *extraout_RDX_03;
  AggregationOp *extraout_RDX_04;
  AggregationOp *extraout_RDX_05;
  AggregationOp *extraout_RDX_06;
  AggregationOp *pAVar23;
  uint __uval;
  anon_union_8_7_33918203_for_value aVar24;
  undefined8 uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  Caliper c_1;
  string output;
  Variant v_data;
  Aggregator output_agg;
  CaliWriter writer;
  Attribute chn_attr;
  Aggregator summary_cross_agg;
  Aggregator cross_agg;
  ChannelPtr p;
  vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_> infovec;
  size_type __dnew_1;
  string outdir;
  Caliper c;
  _Any_data local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  _Any_data local_3d8;
  code *local_3c8;
  code *pcStack_3c0;
  CaliperMetadataDB *local_3b8;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [40];
  Aggregator local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  Options *local_358;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_350;
  undefined8 local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_340;
  ChannelController *local_338;
  CaliWriter local_330;
  Channel local_320;
  ChannelController *local_310;
  Aggregator local_308;
  Aggregator local_2f8;
  ConfigManager local_2e8;
  undefined1 local_2d8 [24];
  SnapshotProcessFn local_2c0;
  undefined1 local_2a0 [8];
  anon_union_8_7_33918203_for_value local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_> local_220;
  vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_> local_1f8 [3];
  undefined1 local_1b0 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
  local_120 [5];
  int local_a0;
  Node *local_98;
  anon_union_8_7_33918203_for_value aStack_90;
  Attribute *local_88;
  Node *local_80;
  Caliper local_78;
  code *local_58;
  anon_union_8_7_33918203_for_value aStack_50;
  vector<cali::Entry,_std::allocator<cali::Entry>_> local_48;
  
  bVar9 = cali::ChannelController::is_instantiated((ChannelController *)this);
  poVar14 = (ostream *)local_2a0;
  if (bVar9) {
    std::ofstream::ofstream(poVar14);
    local_a0 = 1;
    iVar10 = cali::Log::verbosity();
    if (local_a0 <= iVar10) {
      poVar14 = cali::Log::get_stream((Log *)local_2a0);
    }
    cali::ChannelController::name_abi_cxx11_((string *)&local_3d8,(ChannelController *)this);
    local_3a0._24_8_ = comm;
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,(char *)local_3d8._M_unused._0_8_,local_3d8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": Flushing Caliper data",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    if ((code **)local_3d8._M_unused._0_8_ != &local_3c8) {
      operator_delete(local_3d8._M_unused._M_object,(ulong)(local_3c8 + 1));
    }
    local_2a0 = (undefined1  [8])_VTT;
    local_340 = _VTT;
    local_348 = ___throw_bad_array_new_length;
    *(undefined8 *)(local_2a0 + *(long *)((long)_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&local_298.v_bool);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 8));
    SVar11 = cali::OutputStream::type(stream);
    local_3a0._16_8_ = this;
    if (SVar11 == None) {
      cali::ConfigManager::Options::get_abi_cxx11_((string *)local_2a0,&this->m_opts,"outdir","");
      cali::ConfigManager::Options::get_abi_cxx11_((string *)&local_3d8,&this->m_opts,"output","");
      if ((code *)local_3d8._8_8_ == (code *)0x0) {
        cali::util::create_filename_abi_cxx11_((string *)&local_3f8,(util *)".cali",ext);
        std::__cxx11::string::operator=
                  ((string *)local_3d8._M_pod_data,(string *)local_3f8._M_pod_data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_unused._0_8_ != &local_3e8) {
          operator_delete(local_3f8._M_unused._M_object,
                          CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                                   local_3e8._M_allocated_capacity._0_5_) + 1);
        }
      }
      if (((local_298.v_uint != 0) &&
          (iVar10 = std::__cxx11::string::compare(local_3d8._M_pod_data), iVar10 != 0)) &&
         (iVar10 = std::__cxx11::string::compare(local_3d8._M_pod_data), iVar10 != 0)) {
        local_368._M_allocated_capacity._0_2_ = 0x2f;
        local_378.mP.
        super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
        local_378.mP.
        super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_368;
        plVar15 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_378,0,(char *)0x0,(ulong)local_2a0);
        pEVar22 = (pointer)(plVar15 + 2);
        if ((pointer)*plVar15 == pEVar22) {
          local_3a0._0_8_ = pEVar22->m_node;
          local_3a0._8_8_ = plVar15[3];
          local_3b0._0_8_ = (pointer)local_3a0;
        }
        else {
          local_3a0._0_8_ = pEVar22->m_node;
          local_3b0._0_8_ = (pointer)*plVar15;
        }
        local_3b0._8_8_ = *(anon_union_8_7_33918203_for_value *)(plVar15 + 1);
        *plVar15 = (long)pEVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    (local_3b0,local_3d8._M_unused._M_member_pointer);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 == paVar16) {
          lVar3 = plVar15[3];
          local_3e8._M_allocated_capacity._0_5_ = (undefined5)paVar16->_M_allocated_capacity;
          local_3e8._M_allocated_capacity._5_3_ =
               (undefined3)(paVar16->_M_allocated_capacity >> 0x28);
          local_3e8._8_4_ = (undefined4)lVar3;
          local_3e8._M_local_buf[0xc] = (char)((ulong)lVar3 >> 0x20);
          local_3e8._M_local_buf[0xd] = (char)((ulong)lVar3 >> 0x28);
          local_3e8._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
          local_3f8._M_unused._M_object = &local_3e8;
        }
        else {
          local_3e8._M_allocated_capacity._0_5_ = (undefined5)paVar16->_M_allocated_capacity;
          local_3e8._M_allocated_capacity._5_3_ =
               (undefined3)(paVar16->_M_allocated_capacity >> 0x28);
          local_3f8._M_unused._M_object =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar15;
        }
        local_3f8._8_8_ = plVar15[1];
        *plVar15 = (long)paVar16;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::operator=
                  ((string *)local_3d8._M_pod_data,(string *)local_3f8._M_pod_data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_unused._0_8_ != &local_3e8) {
          operator_delete(local_3f8._M_unused._M_object,
                          CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                                   local_3e8._M_allocated_capacity._0_5_) + 1);
        }
        if ((pointer)local_3b0._0_8_ != (pointer)local_3a0) {
          operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
        }
        this = (SpotController *)local_3a0._16_8_;
        if (local_378.mP.
            super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)&local_368) {
          operator_delete(local_378.mP.
                          super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,CONCAT62(local_368._M_allocated_capacity._2_6_,
                                           local_368._M_allocated_capacity._0_2_) + 1);
        }
      }
      cali::Caliper::Caliper((Caliper *)&local_3f8);
      cali::OutputStream::OutputStream((OutputStream *)&local_378);
      uVar4 = local_3d8._M_unused._0_8_;
      cali::Caliper::get_globals
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_3b0,
                 (Caliper *)&local_3f8);
      cali::OutputStream::set_filename
                ((OutputStream *)&local_378,(char *)uVar4,
                 (CaliperMetadataAccessInterface *)&local_3f8,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_3b0);
      if ((pointer)local_3b0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_3b0._0_8_,local_3a0._0_8_ - local_3b0._0_8_);
      }
      if ((code **)local_3d8._M_unused._0_8_ != &local_3c8) {
        operator_delete(local_3d8._M_unused._M_object,(ulong)(local_3c8 + 1));
      }
      if (local_2a0 != (undefined1  [8])local_290) {
        operator_delete((void *)local_2a0,
                        CONCAT35(local_290[0]._M_allocated_capacity._5_3_,
                                 (undefined5)local_290[0]._M_allocated_capacity) + 1);
      }
      (stream->mP).
      super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_378.mP.
           super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(stream->mP).
                  super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 &local_378.mP.
                  super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      cali::OutputStream::~OutputStream((OutputStream *)&local_378);
    }
    cali::Caliper::Caliper(&local_78);
    cali::CaliWriter::CaliWriter(&local_330,stream);
    local_2a0 = (undefined1  [8])local_290;
    local_3f8._M_unused._M_member_pointer = 0x10c;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)local_2a0,(ulong)&local_3f8);
    uVar4 = local_3f8._M_unused._0_8_;
    local_290[0]._M_allocated_capacity._0_5_ = (undefined5)local_3f8._M_unused._M_member_pointer;
    local_290[0]._M_allocated_capacity._5_3_ = (undefined3)((ulong)local_3f8._0_8_ >> 0x28);
    local_2a0 = (undefined1  [8])paVar16;
    memcpy(paVar16,
           " select *,min(inclusive#sum#time.duration) as \"Min time/rank\" unit sec,max(inclusive#sum#time.duration) as \"Max time/rank\" unit sec,avg(inclusive#sum#time.duration) as \"Avg time/rank\" unit sec,sum(inclusive#sum#time.duration) as \"Total time\"    unit sec group by path "
           ,0x10c);
    local_298.v_uint = uVar4;
    paVar16->_M_local_buf[uVar4] = '\0';
    local_358 = (Options *)((long)this + 0x18U);
    cali::ConfigManager::Options::build_query
              ((string *)&local_3d8,(Options *)((long)this + 0x18U),"cross",(string *)local_2a0);
    if (local_2a0 != (undefined1  [8])local_290) {
      operator_delete((void *)local_2a0,
                      CONCAT35(local_290[0]._M_allocated_capacity._5_3_,
                               (undefined5)local_290[0]._M_allocated_capacity) + 1);
    }
    parse_spec((QuerySpec *)local_2a0,(char *)local_3d8._M_unused._0_8_);
    cali::Aggregator::Aggregator(&local_378,(QuerySpec *)local_2a0);
    local_3b8 = (CaliperMetadataDB *)((long)this + 0x78);
    cali::CaliperMetadataDB::add_attribute_aliases
              (local_3b8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_180);
    cali::CaliperMetadataDB::add_attribute_units
              (local_3b8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_150);
    local_3b0._0_8_ = local_3a0;
    local_2c0.super__Function_base._M_functor._M_unused._M_member_pointer = 0x6e;
    pNVar17 = (Node *)std::__cxx11::string::_M_create((ulong *)local_3b0,(ulong)&local_2c0);
    uVar4 = local_2c0.super__Function_base._M_functor._M_unused._0_8_;
    local_3a0._0_8_ = local_2c0.super__Function_base._M_functor._M_unused._M_member_pointer;
    local_3b0._0_8_ = pNVar17;
    memcpy(pNVar17,
           " let sum#time.duration=scale(sum#time.duration.ns,1e-9) select inclusive_sum(sum#time.duration) group by path "
           ,0x6e);
    local_3b0._8_8_ = uVar4;
    *(undefined1 *)((long)&(pNVar17->super_LockfreeIntrusiveTree<cali::Node>).m_me + uVar4) = 0;
    cali::ConfigManager::Options::build_query
              ((string *)&local_3f8,local_358,"local",(string *)local_3b0);
    if ((Node *)local_3b0._0_8_ != (Node *)local_3a0) {
      operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
    }
    uVar4 = local_3f8._M_unused._0_8_;
    pCVar18 = cali::ChannelController::channel_body((ChannelController *)this);
    local_aggregate((char *)uVar4,&local_78,pCVar18,local_3b8,&local_378);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_unused._0_8_ != &local_3e8) {
      operator_delete(local_3f8._M_unused._M_object,
                      CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                               local_3e8._M_allocated_capacity._0_5_) + 1);
    }
    (*(code *)(((LockfreeIntrusiveTree<cali::Node> *)local_3a0._24_8_)->m_me->m_treenode).head._M_b.
              _M_p)(local_3a0._24_8_,local_3b8,&local_378);
    iVar10 = (*(code *)((LockfreeIntrusiveTree<cali::Node> *)local_3a0._24_8_)->m_me->m_id)();
    if (iVar10 == 0) {
      *(size_type *)((long)this + 0x30) = 0;
      *(((string *)((long)this + 0x28))->_M_dataplus)._M_p = '\0';
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT35(local_290[0]._M_allocated_capacity._5_3_,
                            (undefined5)local_290[0]._M_allocated_capacity);
      if (local_298 != paVar16) {
        psVar1 = (string *)(local_3a0._16_8_ + 0x28);
        pAVar23 = extraout_RDX;
        aVar24 = local_298;
        do {
          if (*(size_type *)(local_3a0._16_8_ + 0x30) != 0) {
            std::__cxx11::string::append((char *)psVar1);
            pAVar23 = extraout_RDX_00;
          }
          cali::Aggregator::get_aggregation_attribute_name_abi_cxx11_
                    ((string *)&local_3f8,(Aggregator *)aVar24.unmanaged_ptr,pAVar23);
          std::__cxx11::string::_M_append((char *)psVar1,local_3f8._M_unused._M_member_pointer);
          pAVar23 = extraout_RDX_01;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_unused._0_8_ != &local_3e8) {
            operator_delete(local_3f8._M_unused._M_object,
                            CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                                     local_3e8._M_allocated_capacity._0_5_) + 1);
            pAVar23 = extraout_RDX_02;
          }
          aVar24.unmanaged_ptr = (void *)(aVar24.v_uint + 0x38);
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)aVar24.v_uint != paVar16);
      }
      this = (SpotController *)local_3a0._16_8_;
      pCVar5 = local_3b8;
      local_3b0._0_8_ = (Node *)0xd72706504;
      local_3b0._8_8_ = "regionprofile";
      pNVar17 = cali::CaliperMetadataDB::make_tree_entry
                          (local_3b8,1,(Attribute *)(local_3a0._16_8_ + 0x88),(Variant *)local_3b0,
                           (Node *)0x0);
      local_98 = (Node *)(pNVar17->m_data).m_v.type_and_size;
      aStack_90 = (pNVar17->m_data).m_v.value;
      local_3e8._M_allocated_capacity._0_5_ = 0;
      local_3e8._M_allocated_capacity._5_3_ = 0;
      local_3e8._8_4_ = 0;
      local_3e8._M_local_buf[0xc] = '\0';
      local_3e8._M_local_buf[0xd] = '\0';
      local_3e8._14_2_ = 0;
      local_3f8._M_unused._M_object = (void *)0x0;
      local_3f8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_3f8._M_unused._M_object = operator_new(0x20);
      *(CaliWriter **)local_3f8._M_unused._0_8_ = &local_330;
      *(Node **)((long)local_3f8._M_unused._0_8_ + 8) = pNVar17;
      *(Node **)((long)local_3f8._M_unused._0_8_ + 0x10) = local_98;
      ((Node *)((long)local_3f8._M_unused._0_8_ + 0x18))->parent = (Node *)aStack_90;
      local_3e8._8_4_ = 0x21806a;
      local_3e8._M_local_buf[0xc] = '\0';
      local_3e8._M_local_buf[0xd] = '\0';
      local_3e8._14_2_ = 0;
      local_3e8._M_allocated_capacity._0_5_ = 0x2180f4;
      local_3e8._M_allocated_capacity._5_3_ = 0;
      cali::Aggregator::flush
                (&local_378,&pCVar5->super_CaliperMetadataAccessInterface,
                 (SnapshotProcessFn *)&local_3f8);
      if ((code *)CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                           local_3e8._M_allocated_capacity._0_5_) != (code *)0x0) {
        (*(code *)CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                           local_3e8._M_allocated_capacity._0_5_))(&local_3f8,&local_3f8,3);
      }
    }
    cali::Aggregator::~Aggregator(&local_378);
    std::vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>::
    ~vector(local_120);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_150);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_180);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_1b0);
    std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::~vector
              (local_1f8);
    std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::~vector
              (&local_220);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_248);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_270);
    std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
    ~vector((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
             *)&local_298);
    if ((code **)local_3d8._M_unused._0_8_ != &local_3c8) {
      operator_delete(local_3d8._M_unused._M_object,(ulong)(local_3c8 + 1));
    }
    bVar9 = cali::ConfigManager::Options::is_enabled(local_358,"timeseries");
    if (bVar9) {
      cali::ConfigManager::get_channel(&local_2e8,(char *)((long)this + 0x68));
      _Var7._M_pi = local_2e8.mP.
                    super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      if (local_2e8.mP.
          super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        poVar14 = (ostream *)local_2a0;
        std::ofstream::ofstream(poVar14);
        local_a0 = 0;
        iVar10 = cali::Log::verbosity();
        if (local_a0 <= iVar10) {
          poVar14 = cali::Log::get_stream((Log *)local_2a0);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"[spot controller]: Timeseries channel not found!",0x30);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        local_2a0 = (undefined1  [8])local_340;
        *(undefined8 *)(local_2a0 + *(long *)((long)local_340 + -0x18)) = local_348;
        std::filebuf::~filebuf((filebuf *)&local_298.v_bool);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 8));
      }
      else {
        local_338 = (ChannelController *)
                    __dynamic_cast(local_2e8.mP.
                                   super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,&cali::ChannelController::typeinfo,
                                   &(anonymous_namespace)::SpotTimeseriesController::typeinfo,0);
        local_350 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
            local_338 != (ChannelController *)0x0) {
          local_350 = _Var7._M_pi;
          if (__libc_single_threaded == '\0') {
            LOCK();
            (_Var7._M_pi)->_M_use_count = (_Var7._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (_Var7._M_pi)->_M_use_count = (_Var7._M_pi)->_M_use_count + 1;
          }
        }
        cali::CalQLParser::CalQLParser
                  ((CalQLParser *)&local_3d8,
                   "aggregate max(sum#loop.iterations),max(count) group by loop");
        cali::CalQLParser::spec((QuerySpec *)local_2a0,(CalQLParser *)&local_3d8);
        cali::Aggregator::Aggregator(&local_308,(QuerySpec *)local_2a0);
        std::
        vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>::
        ~vector(local_120);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_150);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_180);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1b0);
        std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::~vector
                  (local_1f8);
        std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::
        ~vector(&local_220);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_248);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_270);
        std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
        ::~vector((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                   *)&local_298);
        cali::CalQLParser::~CalQLParser((CalQLParser *)&local_3d8);
        pCVar18 = cali::ChannelController::channel_body(local_338);
        pCVar5 = local_3b8;
        local_aggregate("aggregate count(),sum(loop.iterations) where loop group by loop",&local_78,
                        pCVar18,local_3b8,&local_308);
        (*(code *)(((LockfreeIntrusiveTree<cali::Node> *)local_3a0._24_8_)->m_me->m_treenode).head.
                  _M_b._M_p)(local_3a0._24_8_,pCVar5,&local_308);
        local_2c0.super__Function_base._M_functor._M_unused._M_object = local_2d8;
        local_2d8._0_8_ = (Node *)0x0;
        local_2d8._8_8_ = (Node *)0x0;
        local_2d8._16_8_ = (pointer)0x0;
        local_2c0.super__Function_base._M_functor._8_8_ = 0;
        local_2c0._M_invoker =
             std::
             _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:359:39)>
             ::_M_invoke;
        local_2c0.super__Function_base._M_manager =
             std::
             _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:359:39)>
             ::_M_manager;
        cali::Aggregator::flush(&local_308,&pCVar5->super_CaliperMetadataAccessInterface,&local_2c0)
        ;
        if ((__pointer_type)local_2c0.super__Function_base._M_manager != (__pointer_type)0x0) {
          (*local_2c0.super__Function_base._M_manager)(&local_2c0,&local_2c0,3);
        }
        local_98 = (Node *)local_2d8._8_8_;
        if (local_2d8._0_8_ == local_2d8._8_8_) {
          poVar14 = (ostream *)local_2a0;
          std::ofstream::ofstream(poVar14);
          local_a0 = 1;
          iVar10 = cali::Log::verbosity();
          if (local_a0 <= iVar10) {
            poVar14 = cali::Log::get_stream((Log *)local_2a0);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,"[spot controller]: No instrumented loops found",0x2e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
          std::ostream::put((char)poVar14);
          std::ostream::flush();
          local_2a0 = (undefined1  [8])local_340;
          *(undefined8 *)(local_2a0 + *(long *)((long)local_340 + -0x18)) = local_348;
          std::filebuf::~filebuf((filebuf *)&local_298.v_bool);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 8));
        }
        else {
          local_310 = local_338 + 1;
          local_88 = (Attribute *)((long)this + 0x88);
          pNVar17 = (Node *)local_2d8._0_8_;
          do {
            uVar4 = local_3a0._24_8_;
            if (0 < *(int *)&(pNVar17->m_treenode).next) {
              uVar12 = (*(code *)(((LockfreeIntrusiveTree<cali::Node> *)local_3a0._24_8_)->m_me->
                                 m_treenode).parent)(local_3a0._24_8_);
              iVar10 = (*(code *)(((LockfreeIntrusiveTree<cali::Node> *)uVar4)->m_me->m_treenode).
                                 parent)(uVar4,(ulong)*(uint *)((long)&(pNVar17->m_treenode).next +
                                                               4));
              (*(code *)(((LockfreeIntrusiveTree<cali::Node> *)uVar4)->m_me->m_treenode).next)
                        (local_3b0,uVar4,pNVar17);
              if (0 < (int)uVar12) {
                bVar9 = cali::ConfigManager::Options::is_set(local_358,"timeseries.maxrows");
                uVar13 = 0x14;
                if (bVar9) {
                  cali::ConfigManager::Options::get_abi_cxx11_
                            ((string *)&local_3d8,local_358,"timeseries.maxrows","");
                  local_2a0 = (undefined1  [8])local_290;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_2a0,local_3d8._M_unused._M_object,
                             (code *)(local_3d8._8_8_ + (long)local_3d8._M_unused._0_8_));
                  uVar13 = cali::StringConverter::to_int((StringConverter *)local_2a0,(bool *)0x0);
                  if (local_2a0 != (undefined1  [8])local_290) {
                    operator_delete((void *)local_2a0,
                                    CONCAT35(local_290[0]._M_allocated_capacity._5_3_,
                                             (undefined5)local_290[0]._M_allocated_capacity) + 1);
                  }
                  if ((code **)local_3d8._M_unused._0_8_ != &local_3c8) {
                    operator_delete(local_3d8._M_unused._M_object,(ulong)(local_3c8 + 1));
                  }
                  if (0 < (int)uVar13) goto LAB_00216223;
                  uVar28 = 1;
                }
                else {
LAB_00216223:
                  uVar28 = 1;
                  if ((int)uVar13 < iVar10) {
                    uVar28 = (ulong)uVar12 / (ulong)uVar13;
                  }
                }
                local_3f8._M_unused._M_object = &local_3e8;
                local_378.mP.
                super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0xf1;
                paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)std::__cxx11::string::_M_create
                                       ((ulong *)local_3f8._M_pod_data,(ulong)&local_378);
                peVar6 = local_378.mP.
                         super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                local_3e8._M_allocated_capacity._0_5_ =
                     SUB85(local_378.mP.
                           super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,0);
                local_3e8._M_allocated_capacity._5_3_ =
                     (undefined3)
                     ((ulong)local_378.mP.
                             super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr >> 0x28);
                local_3f8._M_unused._0_8_ = (undefined8)paVar16;
                memcpy(paVar16,
                       " select cali.channel,loop,block,max(sum#loop.iterations) as \"Iterations\" unit iterations,max(scale#time.duration.ns) as \"Time (s)\" unit sec,avg(ratio#loop.iterations/time.duration.ns) as \"Iter/s\" unit iter/s group by cali.channel,loop,block "
                       ,0xf1);
                local_3f8._8_8_ = peVar6;
                paVar16->_M_local_buf[(long)peVar6] = '\0';
                cali::ConfigManager::Options::build_query
                          ((string *)&local_3d8,(Options *)local_310,"cross",(string *)&local_3f8);
                pCVar5 = local_3b8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3f8._M_unused._0_8_ != &local_3e8) {
                  operator_delete(local_3f8._M_unused._M_object,
                                  CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                                           local_3e8._M_allocated_capacity._0_5_) + 1);
                }
                parse_spec((QuerySpec *)local_2a0,(char *)local_3d8._M_unused._0_8_);
                if ((code **)local_3d8._M_unused._0_8_ != &local_3c8) {
                  operator_delete(local_3d8._M_unused._M_object,(ulong)(local_3c8 + 1));
                }
                cali::Aggregator::Aggregator(&local_2f8,(QuerySpec *)local_2a0);
                cali::CaliperMetadataDB::add_attribute_aliases
                          (pCVar5,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_180);
                cali::CaliperMetadataDB::add_attribute_units
                          (local_3b8,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_150);
                local_80 = pNVar17;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_378,(char *)local_3b0._0_8_,
                           (allocator<char> *)(local_3a0 + 0x27));
                uVar26 = (uint)uVar28;
                uVar12 = uVar26 + (uVar26 == 0);
                local_3f8._M_unused._M_member_pointer = 0x9f;
                local_3d8._M_unused._M_object = &local_3c8;
                __dest = (code **)std::__cxx11::string::_M_create
                                            ((ulong *)local_3d8._M_pod_data,(ulong)&local_3f8);
                uVar4 = local_3f8._M_unused._0_8_;
                local_3c8 = (code *)local_3f8._M_unused._0_8_;
                local_3d8._M_unused._M_object = __dest;
                memcpy(__dest,
                       " select cali.channel,loop,block,scale(time.duration.ns,1e-9),sum(loop.iterations),ratio(loop.iterations,time.duration.ns,1e9) group by cali.channel,loop,block "
                       ,0x9f);
                local_3d8._8_8_ = uVar4;
                *(code *)((long)__dest + uVar4) = (code)0x0;
                pcVar19 = (char *)std::__cxx11::string::append(local_3d8._M_pod_data);
                pNVar17 = local_80;
                uVar13 = 1;
                if (9 < uVar26) {
                  uVar26 = 4;
                  do {
                    uVar13 = uVar26;
                    uVar27 = (uint)uVar28;
                    if (uVar27 < 100) {
                      uVar13 = uVar13 - 2;
                      goto LAB_00216430;
                    }
                    if (uVar27 < 1000) {
                      uVar13 = uVar13 - 1;
                      goto LAB_00216430;
                    }
                    if (uVar27 < 10000) goto LAB_00216430;
                    uVar28 = uVar28 / 10000;
                    uVar26 = uVar13 + 4;
                  } while (99999 < uVar27);
                  uVar13 = uVar13 + 1;
                }
LAB_00216430:
                local_3f8._M_unused._M_object = &local_3e8;
                std::__cxx11::string::_M_construct
                          ((ulong)&local_3f8,(char)uVar13 - (char)((int)uVar12 >> 0x1f));
                std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)((ulong)(uVar12 >> 0x1f) + (long)local_3f8._M_unused._0_8_),
                           uVar13,uVar12);
                pcVar19 = (char *)std::__cxx11::string::_M_append
                                            (pcVar19,local_3f8._M_unused._M_member_pointer);
                std::__cxx11::string::append(pcVar19);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3f8._M_unused._0_8_ != &local_3e8) {
                  operator_delete(local_3f8._M_unused._M_object,
                                  CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                                           local_3e8._M_allocated_capacity._0_5_) + 1);
                }
                pcVar19 = (char *)std::__cxx11::string::append(local_3d8._M_pod_data);
                pcVar19 = (char *)std::__cxx11::string::_M_append
                                            (pcVar19,(ulong)local_378.mP.
                                                                                                                        
                                                  super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                std::__cxx11::string::append(pcVar19);
                cali::ConfigManager::Options::build_query
                          ((string *)&local_3f8,(Options *)local_310,"local",(string *)&local_3d8);
                cali::ChannelController::channel(local_338);
                if ((local_320.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (0 < (local_320.mP.
                         super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count)) {
                  local_aggregate((char *)local_3f8._M_unused._0_8_,&local_78,
                                  local_320.mP.
                                  super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,local_3b8,&local_2f8);
                }
                cali::Channel::~Channel(&local_320);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3f8._M_unused._0_8_ != &local_3e8) {
                  operator_delete(local_3f8._M_unused._M_object,
                                  CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                                           local_3e8._M_allocated_capacity._0_5_) + 1);
                }
                if ((code **)local_3d8._M_unused._0_8_ != &local_3c8) {
                  operator_delete(local_3d8._M_unused._M_object,(ulong)(local_3c8 + 1));
                }
                if (local_378.mP.
                    super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (element_type *)&local_368) {
                  operator_delete(local_378.mP.
                                  super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,CONCAT62(local_368._M_allocated_capacity._2_6_,
                                                   local_368._M_allocated_capacity._0_2_) + 1);
                }
                (*(code *)(((LockfreeIntrusiveTree<cali::Node> *)local_3a0._24_8_)->m_me->m_treenode
                          ).head._M_b._M_p)(local_3a0._24_8_,local_3b8,&local_2f8);
                iVar10 = (*(code *)((LockfreeIntrusiveTree<cali::Node> *)local_3a0._24_8_)->m_me->
                                   m_id)();
                if (iVar10 == 0) {
                  *(size_type *)(local_3a0._16_8_ + 0x50) = 0;
                  *(((string *)(local_3a0._16_8_ + 0x48))->_M_dataplus)._M_p = '\0';
                  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT35(local_290[0]._M_allocated_capacity._5_3_,
                                        (undefined5)local_290[0]._M_allocated_capacity);
                  pAVar23 = extraout_RDX_03;
                  for (aVar24 = local_298; aVar24 != paVar16;
                      aVar24.unmanaged_ptr = (void *)(aVar24.v_uint + 0x38)) {
                    if (*(size_type *)(local_3a0._16_8_ + 0x50) != 0) {
                      std::__cxx11::string::append((char *)((long)this + 0x48U));
                      pAVar23 = extraout_RDX_04;
                    }
                    cali::Aggregator::get_aggregation_attribute_name_abi_cxx11_
                              ((string *)&local_3d8,(Aggregator *)aVar24.unmanaged_ptr,pAVar23);
                    std::__cxx11::string::_M_append
                              ((char *)((long)this + 0x48U),local_3d8._M_unused._M_member_pointer);
                    pAVar23 = extraout_RDX_05;
                    if ((code **)local_3d8._M_unused._0_8_ != &local_3c8) {
                      operator_delete(local_3d8._M_unused._M_object,(ulong)(local_3c8 + 1));
                      pAVar23 = extraout_RDX_06;
                    }
                  }
                  local_3f8._M_unused._M_object = &DAT_a74657304;
                  local_3f8._8_8_ = (long)",timeseries" + 1;
                  pNVar20 = cali::CaliperMetadataDB::make_tree_entry
                                      (local_3b8,1,local_88,(Variant *)&local_3f8,(Node *)0x0);
                  local_58 = (code *)(pNVar20->m_data).m_v.type_and_size;
                  aStack_50 = (pNVar20->m_data).m_v.value;
                  local_3c8 = (code *)0x0;
                  pcStack_3c0 = (code *)0x0;
                  local_3d8._M_unused._M_object = (void *)0x0;
                  local_3d8._8_8_ = (code *)0x0;
                  local_3d8._M_unused._M_object = operator_new(0x20);
                  *(CaliWriter **)local_3d8._M_unused._0_8_ = &local_330;
                  *(Node **)((long)local_3d8._M_unused._0_8_ + 8) = pNVar20;
                  *(code **)((long)local_3d8._M_unused._0_8_ + 0x10) = local_58;
                  *(anon_union_8_7_33918203_for_value *)((long)local_3d8._M_unused._0_8_ + 0x18) =
                       aStack_50;
                  pcStack_3c0 = std::
                                _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:330:21)>
                                ::_M_invoke;
                  local_3c8 = std::
                              _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:330:21)>
                              ::_M_manager;
                  cali::Aggregator::flush
                            (&local_2f8,&local_3b8->super_CaliperMetadataAccessInterface,
                             (SnapshotProcessFn *)&local_3d8);
                  if (local_3c8 != (code *)0x0) {
                    (*local_3c8)(&local_3d8,&local_3d8,3);
                  }
                }
                cali::Aggregator::~Aggregator(&local_2f8);
                std::
                vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
                ::~vector(local_120);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&local_150);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&local_180);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_1b0);
                std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::
                ~vector(local_1f8);
                std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>
                ::~vector(&local_220);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_248);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_270);
                std::
                vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                ::~vector((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                           *)&local_298);
              }
              if ((Node *)local_3b0._0_8_ != (Node *)local_3a0) {
                operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
              }
            }
            pNVar17 = (Node *)&(pNVar17->m_treenode).head;
          } while (pNVar17 != local_98);
        }
        std::
        vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>::
        ~vector((vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                 *)local_2d8);
        cali::Aggregator::~Aggregator(&local_308);
        this = (SpotController *)local_3a0._16_8_;
        if (local_350 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350);
        }
      }
      if (local_2e8.mP.
          super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2e8.mP.
                   super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    iVar10 = (*(code *)((LockfreeIntrusiveTree<cali::Node> *)local_3a0._24_8_)->m_me->m_id)();
    if (iVar10 == 0) {
      pCVar18 = cali::ChannelController::channel_body((ChannelController *)this);
      cali::Caliper::get_globals
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_2a0,&local_78,pCVar18);
      cali::CaliperMetadataDB::import_globals
                (&local_48,local_3b8,&local_78.super_CaliperMetadataAccessInterface,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_2a0);
      if (local_48.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2a0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2a0,
                        CONCAT35(local_290[0]._M_allocated_capacity._5_3_,
                                 (undefined5)local_290[0]._M_allocated_capacity) - (long)local_2a0);
      }
      local_2a0 = (undefined1  [8])local_290;
      local_290[0]._M_allocated_capacity._0_5_ = 0x6f69676572;
      local_290[0]._M_allocated_capacity._5_3_ = 0x72706e;
      local_290[0]._8_5_ = 0x656c69666f;
      local_298.v_uint = 0xd;
      local_290[0]._M_local_buf[0xd] = '\0';
      local_3d8._8_8_ = (code *)0x0;
      local_3c8 = (code *)((ulong)local_3c8 & 0xffffffffffffff00);
      local_3d8._M_unused._M_object = &local_3c8;
      cali::ConfigManager::Options::enabled_options_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_3f8,local_358);
      uVar4 = local_3f8._8_8_;
      if (local_3f8._M_unused._M_object != (void *)local_3f8._8_8_) {
        uVar25 = local_3f8._M_unused._0_8_;
        do {
          if ((code *)local_3d8._8_8_ != (code *)0x0) {
            std::__cxx11::string::append(local_3d8._M_pod_data);
          }
          std::__cxx11::string::_M_append(local_3d8._M_pod_data,*(ulong *)uVar25);
          iVar10 = std::__cxx11::string::compare((char *)uVar25);
          if (iVar10 == 0) {
            std::__cxx11::string::append(local_2a0);
          }
          uVar25 = uVar25 + 0x20;
        } while (uVar25 != uVar4);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3f8);
      pCVar5 = local_3b8;
      local_3e8._M_allocated_capacity._0_5_ = 0x2e746f7073;
      local_3e8._M_allocated_capacity._5_3_ = 0x74656d;
      local_3e8._8_4_ = 0x73636972;
      local_3f8._8_8_ = 0xc;
      local_3e8._M_local_buf[0xc] = '\0';
      local_3f8._M_unused._M_object = &local_3e8;
      local_378.mP.super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               cali::CaliperMetadataDB::create_attribute
                         (local_3b8,(string *)&local_3f8,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                          (Variant *)0x0);
      uVar4 = local_3a0._16_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_unused._0_8_ != &local_3e8) {
        operator_delete(local_3f8._M_unused._M_object,
                        CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                                 local_3e8._M_allocated_capacity._0_5_) + 1);
      }
      local_3b0._0_8_ = (pointer)0x17;
      local_3f8._M_unused._M_object = &local_3e8;
      local_3f8._M_unused._0_8_ =
           (undefined8)
           std::__cxx11::string::_M_create((ulong *)local_3f8._M_pod_data,(ulong)local_3b0);
      local_3e8._M_allocated_capacity._0_5_ = (undefined5)local_3b0._0_8_;
      local_3e8._M_allocated_capacity._5_3_ = SUB83(local_3b0._0_8_,5);
      *(undefined8 *)local_3f8._M_unused._0_8_ = 0x6d69742e746f7073;
      *(char *)((long)local_3f8._M_unused._0_8_ + 8) = 'e';
      *(char *)((long)local_3f8._M_unused._0_8_ + 9) = 's';
      *(char *)((long)local_3f8._M_unused._0_8_ + 10) = 'e';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0xb) = 'r';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0xc) = 'i';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0xd) = 'e';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0xe) = 's';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0xf) = '.';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0xf) = '.';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0x10) = 'm';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0x11) = 'e';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0x12) = 't';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0x13) = 'r';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0x14) = 'i';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0x15) = 'c';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0x16) = 's';
      local_3f8._8_8_ = local_3b0._0_8_;
      *(char *)((long)local_3f8._M_unused._0_8_ + local_3b0._0_8_) = '\0';
      local_2c0.super__Function_base._M_functor._M_unused._0_8_ =
           (undefined8)
           cali::CaliperMetadataDB::create_attribute
                     (pCVar5,(string *)&local_3f8,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                      (Variant *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_unused._0_8_ != &local_3e8) {
        operator_delete(local_3f8._M_unused._M_object,
                        CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                                 local_3e8._M_allocated_capacity._0_5_) + 1);
      }
      local_3b0._0_8_ = (pointer)0x13;
      local_3f8._M_unused._M_object = &local_3e8;
      local_3f8._M_unused._0_8_ =
           (undefined8)
           std::__cxx11::string::_M_create((ulong *)local_3f8._M_pod_data,(ulong)local_3b0);
      local_3e8._M_allocated_capacity._0_5_ = (undefined5)local_3b0._0_8_;
      local_3e8._M_allocated_capacity._5_3_ = SUB83(local_3b0._0_8_,5);
      *(undefined8 *)local_3f8._M_unused._0_8_ = 0x726f662e746f7073;
      *(char *)((long)local_3f8._M_unused._0_8_ + 8) = 'm';
      *(char *)((long)local_3f8._M_unused._0_8_ + 9) = 'a';
      *(char *)((long)local_3f8._M_unused._0_8_ + 10) = 't';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0xb) = '.';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0xc) = 'v';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0xd) = 'e';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0xe) = 'r';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0xf) = 's';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0xf) = 's';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0x10) = 'i';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0x11) = 'o';
      *(char *)((long)local_3f8._M_unused._0_8_ + 0x12) = 'n';
      local_3f8._8_8_ = local_3b0._0_8_;
      *(char *)((long)local_3f8._M_unused._0_8_ + local_3b0._0_8_) = '\0';
      local_2d8._0_8_ =
           cali::CaliperMetadataDB::create_attribute
                     (pCVar5,(string *)&local_3f8,CALI_TYPE_INT,0x200,0,(Attribute *)0x0,
                      (Variant *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_unused._0_8_ != &local_3e8) {
        operator_delete(local_3f8._M_unused._M_object,
                        CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                                 local_3e8._M_allocated_capacity._0_5_) + 1);
      }
      local_3e8._M_allocated_capacity._0_5_ = 0x2e746f7073;
      local_3e8._M_allocated_capacity._5_3_ = 0x74706f;
      local_3e8._8_4_ = 0x736e6f69;
      local_3f8._8_8_ = 0xc;
      local_3e8._M_local_buf[0xc] = '\0';
      local_3f8._M_unused._M_object = &local_3e8;
      local_3b0._0_8_ =
           cali::CaliperMetadataDB::create_attribute
                     (pCVar5,(string *)&local_3f8,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                      (Variant *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_unused._0_8_ != &local_3e8) {
        operator_delete(local_3f8._M_unused._M_object,
                        CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                                 local_3e8._M_allocated_capacity._0_5_) + 1);
      }
      local_3e8._M_allocated_capacity._0_5_ = 0x2e746f7073;
      local_3e8._M_allocated_capacity._5_3_ = 0x616863;
      local_3e8._8_4_ = 0x6c656e6e;
      local_3e8._M_local_buf[0xc] = 's';
      local_3f8._8_8_ = 0xd;
      local_3e8._M_local_buf[0xd] = '\0';
      local_3f8._M_unused._M_object = &local_3e8;
      local_320.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           cali::CaliperMetadataDB::create_attribute
                     (pCVar5,(string *)&local_3f8,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                      (Variant *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_unused._0_8_ != &local_3e8) {
        operator_delete(local_3f8._M_unused._M_object,
                        CONCAT35(local_3e8._M_allocated_capacity._5_3_,
                                 local_3e8._M_allocated_capacity._0_5_) + 1);
      }
      pbVar2 = (byte *)(((string *)(uVar4 + 0x28))->_M_dataplus)._M_p;
      sVar21 = strlen((char *)pbVar2);
      local_3f8._M_unused._0_8_ =
           (undefined8)
           ((sVar21 << 0x20) +
            (ulong)(((uint)pbVar2[sVar21 - 1] |
                    (uint)pbVar2[sVar21 >> 1] << 8 | (uint)*pbVar2 << 0x10) << 8) + 4);
      local_3f8._8_8_ = pbVar2;
      cali::CaliperMetadataDB::set_global(pCVar5,(Attribute *)&local_378,(Variant *)&local_3f8);
      pbVar2 = (byte *)(((string *)(uVar4 + 0x48))->_M_dataplus)._M_p;
      sVar21 = strlen((char *)pbVar2);
      local_3f8._M_unused._0_8_ =
           (undefined8)
           ((sVar21 << 0x20) +
            (ulong)(((uint)pbVar2[sVar21 - 1] |
                    (uint)pbVar2[sVar21 >> 1] << 8 | (uint)*pbVar2 << 0x10) << 8) + 4);
      local_3f8._8_8_ = pbVar2;
      cali::CaliperMetadataDB::set_global(pCVar5,(Attribute *)&local_2c0,(Variant *)&local_3f8);
      local_3f8._M_unused._M_member_pointer = 2;
      local_3f8._8_8_ = 2;
      cali::CaliperMetadataDB::set_global(pCVar5,(Attribute *)local_2d8,(Variant *)&local_3f8);
      uVar25 = local_3d8._M_unused._0_8_;
      sVar21 = strlen((char *)local_3d8._M_unused._0_8_);
      local_3f8._M_unused._0_8_ =
           (undefined8)
           ((sVar21 << 0x20) +
            (ulong)(((uint)*(byte *)(uVar25 + (sVar21 - 1)) |
                    (uint)*(byte *)(uVar25 + (sVar21 >> 1)) << 8 | (uint)*(byte *)uVar25 << 0x10) <<
                   8) + 4);
      local_3f8._8_8_ = uVar25;
      cali::CaliperMetadataDB::set_global(pCVar5,(Attribute *)local_3b0,(Variant *)&local_3f8);
      auVar8 = local_2a0;
      sVar21 = strlen((char *)local_2a0);
      local_3f8._M_unused._0_8_ =
           (undefined8)
           ((sVar21 << 0x20) +
            (ulong)(((uint)*(byte *)((long)auVar8 + (sVar21 - 1)) |
                    (uint)*(byte *)((long)auVar8 + (sVar21 >> 1)) << 8 |
                    (uint)*(byte *)auVar8 << 0x10) << 8) + 4);
      local_3f8._8_8_ = auVar8;
      cali::CaliperMetadataDB::set_global(pCVar5,(Attribute *)&local_320,(Variant *)&local_3f8);
      if ((code **)local_3d8._M_unused._0_8_ != &local_3c8) {
        operator_delete(local_3d8._M_unused._M_object,(ulong)(local_3c8 + 1));
      }
      if (local_2a0 != (undefined1  [8])local_290) {
        operator_delete((void *)local_2a0,
                        CONCAT35(local_290[0]._M_allocated_capacity._5_3_,
                                 (undefined5)local_290[0]._M_allocated_capacity) + 1);
      }
      cali::CaliperMetadataDB::get_globals
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_2a0,pCVar5);
      cali::CaliWriter::write_globals
                (&local_330,&pCVar5->super_CaliperMetadataAccessInterface,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_2a0);
      if (local_2a0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2a0,
                        CONCAT35(local_290[0]._M_allocated_capacity._5_3_,
                                 (undefined5)local_290[0]._M_allocated_capacity) - (long)local_2a0);
      }
      poVar14 = (ostream *)local_2a0;
      std::ofstream::ofstream(poVar14);
      local_a0 = 1;
      iVar10 = cali::Log::verbosity();
      if (local_a0 <= iVar10) {
        poVar14 = cali::Log::get_stream((Log *)local_2a0);
      }
      cali::ChannelController::name_abi_cxx11_((string *)&local_3d8,(ChannelController *)uVar4);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,(char *)local_3d8._M_unused._0_8_,local_3d8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,": Wrote ",8);
      cali::CaliWriter::num_written(&local_330);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," records.",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
      if ((code **)local_3d8._M_unused._0_8_ != &local_3c8) {
        operator_delete(local_3d8._M_unused._M_object,(ulong)(local_3c8 + 1));
      }
      local_2a0 = (undefined1  [8])local_340;
      *(undefined8 *)(local_2a0 + *(long *)((long)local_340 + -0x18)) = local_348;
      std::filebuf::~filebuf((filebuf *)&local_298.v_bool);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 8));
    }
    cali::CaliWriter::~CaliWriter(&local_330);
  }
  else {
    std::ofstream::ofstream(poVar14);
    local_a0 = 0;
    iVar10 = cali::Log::verbosity();
    if (local_a0 <= iVar10) {
      poVar14 = cali::Log::get_stream((Log *)local_2a0);
    }
    cali::ChannelController::name_abi_cxx11_((string *)&local_3d8,(ChannelController *)this);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,(char *)local_3d8._M_unused._0_8_,local_3d8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,": SpotController: channel not instantiated\n",0x2b);
    if ((code **)local_3d8._M_unused._0_8_ != &local_3c8) {
      operator_delete(local_3d8._M_unused._M_object,(ulong)(local_3c8 + 1));
    }
    local_2a0 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_2a0 + *(long *)((long)_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&local_298.v_bool);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 8));
  }
  return;
}

Assistant:

void collective_flush(OutputStream& stream, Comm& comm) override
    {
        if (!is_instantiated()) {
            Log(0).stream() << name() << ": SpotController: channel not instantiated\n";
            return;
        }

        Log(1).stream() << name() << ": Flushing Caliper data" << std::endl;

        if (stream.type() == OutputStream::None)
            stream = create_output_stream();

        Caliper    c;
        CaliWriter writer(stream);

        flush_regionprofile(c, writer, comm);

        if (m_opts.is_enabled("timeseries"))
            flush_timeseries(c, writer, comm);

        if (comm.rank() == 0) {
            m_db.import_globals(c, c.get_globals(channel_body()));
            save_spot_metadata();
            writer.write_globals(m_db, m_db.get_globals());

            Log(1).stream() << name() << ": Wrote " << writer.num_written() << " records." << std::endl;
        }
    }